

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall
helics::CoreBroker::findAndNotifyInputTargets
          (CoreBroker *this,BasicHandleInfo *handleInfo,string *key)

{
  pointer ppVar1;
  pointer ppVar2;
  BasicHandleInfo *pBVar3;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  *__range2;
  HandleManager *pHVar4;
  UnknownHandleManager *this_00;
  pair<helics::GlobalHandle,_unsigned_short> *target;
  GlobalHandle GVar5;
  GlobalHandle GVar6;
  vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  local_108;
  HandleManager *local_f0;
  undefined1 local_e8 [8];
  GlobalHandle GStack_e0;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  string local_98;
  string *local_78;
  string *local_70;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  UnknownHandleManager *local_50;
  string *local_48;
  CoreBroker *local_40;
  GlobalHandle local_38;
  
  this_00 = &this->unknownHandles;
  UnknownHandleManager::checkForInputs(&local_108,this_00,(string *)key);
  if (local_108.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_108.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pHVar4 = &this->handles;
    local_38 = (GlobalHandle)
               local_108.
               super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    GVar6 = (GlobalHandle)
            local_108.
            super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    GVar5 = (GlobalHandle)
            local_108.
            super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    local_f0 = pHVar4;
    local_50 = this_00;
    local_48 = key;
    do {
      pBVar3 = HandleManager::findHandle(pHVar4,*(GlobalHandle *)GVar5);
      if (pBVar3 == (BasicHandleInfo *)0x0) {
        local_e8 = *(undefined1 (*) [8])GVar5;
        GStack_e0.fed_id.gid = -2000000000;
        GStack_e0.handle.hid = 0x70;
        local_d8._M_p = (pointer)&local_c8;
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_98._M_string_length = 0;
        local_98.field_2._M_local_buf[0] = '\0';
        local_78 = &local_b8;
        local_70 = &local_98;
        local_68.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        connectInterfaces(this,handleInfo,(uint)handleInfo->flags,(BasicHandleInfo *)local_e8,
                          (uint)*(ushort *)((long)GVar5 + 8),
                          (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                           )0x3200000046);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,
                          CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                   local_98.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        GVar6 = local_38;
        pHVar4 = local_f0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_p != &local_c8) {
          operator_delete(local_d8._M_p,
                          CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) +
                          1);
          pHVar4 = local_f0;
        }
      }
      else {
        connectInterfaces(this,handleInfo,(uint)handleInfo->flags,pBVar3,
                          (uint)*(ushort *)((long)GVar5 + 8),
                          (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                           )0x3200000046);
      }
      key = local_48;
      this_00 = local_50;
      GVar5 = (GlobalHandle)((long)GVar5 + 0xc);
    } while (GVar5 != GVar6);
    if (local_108.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_108.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      UnknownHandleManager::clearInput(local_50,(string *)local_48);
    }
  }
  if ((this->super_BrokerBase).brokerState._M_i == OPERATING) {
    UnknownHandleManager::checkForReconnectionInputs
              ((vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                *)local_e8,this_00,(string *)key);
    ppVar2 = local_108.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar1 = local_108.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_108.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8;
    local_108.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)GStack_e0;
    local_108.
    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._M_p;
    local_e8._0_4_ = 0;
    local_e8._4_4_ = 0;
    GStack_e0.fed_id.gid = 0;
    GStack_e0.handle.hid = 0;
    local_d8._M_p = (pointer)0x0;
    if (((GlobalHandle)ppVar1 != (GlobalHandle)0x0) &&
       (operator_delete(ppVar1,(long)ppVar2 - (long)ppVar1),
       (GlobalHandle)local_e8 != (GlobalHandle)0x0)) {
      operator_delete((void *)local_e8,(long)local_d8._M_p - (long)local_e8);
    }
    ppVar1 = local_108.
             super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_108.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_108.
        super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pHVar4 = &this->handles;
      GVar6 = (GlobalHandle)
              local_108.
              super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_f0 = pHVar4;
      local_40 = this;
      do {
        pBVar3 = HandleManager::findHandle(pHVar4,*(GlobalHandle *)GVar6);
        if (pBVar3 == (BasicHandleInfo *)0x0) {
          local_e8 = *(undefined1 (*) [8])GVar6;
          GStack_e0.fed_id.gid = -2000000000;
          GStack_e0.handle.hid = 0x70;
          local_d8._M_p = (pointer)&local_c8;
          local_d0 = 0;
          local_c8._M_local_buf[0] = '\0';
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          local_b8._M_string_length = 0;
          local_b8.field_2._M_local_buf[0] = '\0';
          local_98._M_string_length = 0;
          local_98.field_2._M_local_buf[0] = '\0';
          local_78 = &local_b8;
          local_70 = &local_98;
          local_68.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_68.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          connectInterfaces(this,handleInfo,(uint)handleInfo->flags,(BasicHandleInfo *)local_e8,
                            (uint)*(ushort *)((long)GVar6 + 8),
                            (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                             )0x3200000046);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,
                            CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                     local_98.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,
                            CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                     local_b8.field_2._M_local_buf[0]) + 1);
          }
          pHVar4 = local_f0;
          this = local_40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_p != &local_c8) {
            operator_delete(local_d8._M_p,
                            CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0])
                            + 1);
            this = local_40;
          }
        }
        else {
          connectInterfaces(this,handleInfo,(uint)handleInfo->flags,pBVar3,
                            (uint)*(ushort *)((long)GVar6 + 8),
                            (pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
                             )0x3200000046);
        }
        GVar6 = (GlobalHandle)((long)GVar6 + 0xc);
      } while (GVar6 != (GlobalHandle)ppVar1);
    }
  }
  if ((GlobalHandle)
      local_108.
      super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (GlobalHandle)0x0) {
    operator_delete(local_108.
                    super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CoreBroker::findAndNotifyInputTargets(BasicHandleInfo& handleInfo, const std::string& key)
{
    auto Handles = unknownHandles.checkForInputs(key);
    for (auto& target : Handles) {
        auto* pub = handles.findHandle(target.first);
        if (pub == nullptr) {
            connectInterfaces(handleInfo,
                              handleInfo.flags,
                              BasicHandleInfo(target.first.fed_id,
                                              target.first.handle,
                                              InterfaceType::PUBLICATION),

                              target.second,
                              std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
        } else {
            connectInterfaces(handleInfo,
                              handleInfo.flags,
                              *pub,

                              target.second,
                              std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
        }
    }
    if (!Handles.empty()) {
        unknownHandles.clearInput(key);
    }
    if (getBrokerState() == BrokerState::OPERATING) {
        Handles = unknownHandles.checkForReconnectionInputs(key);
        for (auto& target : Handles) {
            auto* pub = handles.findHandle(target.first);
            if (pub == nullptr) {
                connectInterfaces(handleInfo,
                                  handleInfo.flags,
                                  BasicHandleInfo(target.first.fed_id,
                                                  target.first.handle,
                                                  InterfaceType::PUBLICATION),

                                  target.second,
                                  std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
            } else {
                connectInterfaces(handleInfo,
                                  handleInfo.flags,
                                  *pub,

                                  target.second,
                                  std::make_pair(CMD_ADD_SUBSCRIBER, CMD_ADD_PUBLISHER));
            }
        }
    }
}